

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

void __thiscall Rml::Element::ClampScrollOffset(Element *this)

{
  Box *this_00;
  Vector2f VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float local_38;
  
  fVar4 = (this->scroll_offset).x;
  fVar5 = (this->scrollable_overflow_rectangle).x;
  this_00 = &this->main_box;
  VVar1 = Box::GetSize(this_00,Padding);
  fVar2 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
  local_38 = VVar1.x;
  if (fVar5 <= local_38 - fVar2) {
    fVar5 = local_38 - fVar2;
  }
  VVar1 = Box::GetSize(this_00,Padding);
  fVar2 = ElementScroll::GetScrollbarSize(&this->meta->scroll,VERTICAL);
  local_38 = VVar1.x;
  fVar5 = fVar5 - (local_38 - fVar2);
  if (fVar5 <= fVar4) {
    fVar4 = fVar5;
  }
  fVar2 = Math::Round(fVar4);
  fVar4 = (this->scroll_offset).y;
  fVar5 = (this->scrollable_overflow_rectangle).y;
  VVar1 = Box::GetSize(this_00,Padding);
  fVar3 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
  fVar3 = VVar1.y - fVar3;
  if (fVar5 <= fVar3) {
    fVar5 = fVar3;
  }
  VVar1 = Box::GetSize(this_00,Padding);
  fVar3 = ElementScroll::GetScrollbarSize(&this->meta->scroll,HORIZONTAL);
  fVar5 = fVar5 - (VVar1.y - fVar3);
  if (fVar5 <= fVar4) {
    fVar4 = fVar5;
  }
  fVar4 = Math::Round(fVar4);
  fVar5 = (this->scroll_offset).x;
  if ((fVar2 == fVar5) && (!NAN(fVar2) && !NAN(fVar5))) {
    fVar5 = (this->scroll_offset).y;
    if ((fVar4 == fVar5) && (!NAN(fVar4) && !NAN(fVar5))) goto LAB_0021a437;
  }
  (this->scroll_offset).x = fVar2;
  (this->scroll_offset).y = fVar4;
  if (this->absolute_offset_dirty == false) {
    DirtyAbsoluteOffsetRecursive(this);
  }
LAB_0021a437:
  ElementScroll::UpdateProperties(&this->meta->scroll);
  return;
}

Assistant:

void Element::ClampScrollOffset()
{
	const Vector2f new_scroll_offset = {
		Math::Round(Math::Min(scroll_offset.x, GetScrollWidth() - GetClientWidth())),
		Math::Round(Math::Min(scroll_offset.y, GetScrollHeight() - GetClientHeight())),
	};

	if (new_scroll_offset != scroll_offset)
	{
		scroll_offset = new_scroll_offset;
		DirtyAbsoluteOffset();
	}

	// At this point the scrollbars have been resolved, both in terms of size and visibility. Update their properties
	// now so that any visibility changes in particular are reflected immediately on the next render. Otherwise we risk
	// that the scrollbars renders a frame late, since changes to scrollbars can happen during layouting.
	meta->scroll.UpdateProperties();
}